

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AsyncPipe::pumpTo(AsyncPipe *this,AsyncOutputStream *output,uint64_t amount)

{
  AsyncCapabilityStream *pAVar1;
  AsyncCapabilityStream *in_RCX;
  AsyncCapabilityStream *s;
  AsyncCapabilityStream *_s281;
  uint64_t amount_local;
  AsyncOutputStream *output_local;
  AsyncPipe *this_local;
  
  amount_local = amount;
  output_local = output;
  this_local = this;
  if (in_RCX == (AsyncCapabilityStream *)0x0) {
    constPromise<unsigned_long,_0UL>();
  }
  else {
    _s281 = in_RCX;
    pAVar1 = kj::_::readMaybe<kj::AsyncCapabilityStream>
                       ((Maybe<kj::AsyncCapabilityStream_&> *)(output + 4));
    if (pAVar1 == (AsyncCapabilityStream *)0x0) {
      newAdaptedPromise<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedPumpTo,kj::(anonymous_namespace)::AsyncPipe&,kj::AsyncOutputStream&,unsigned_long&>
                ((kj *)this,(AsyncPipe *)output,(AsyncOutputStream *)amount_local,
                 (unsigned_long *)&_s281);
    }
    else {
      (*(pAVar1->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[3])
                (this,pAVar1,amount_local,_s281);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<uint64_t> pumpTo(AsyncOutputStream& output, uint64_t amount) override {
    if (amount == 0) {
      return constPromise<uint64_t, 0>();
    } else KJ_IF_SOME(s, state) {
      return s.pumpTo(output, amount);
    } else {
      return newAdaptedPromise<uint64_t, BlockedPumpTo>(*this, output, amount);
    }
  }